

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Maybe<capnp::Orphan<capnp::DynamicValue>_> * __thiscall
capnp::compiler::ValueTranslator::compileValue
          (Maybe<capnp::Orphan<capnp::DynamicValue>_> *__return_storage_ptr__,ValueTranslator *this,
          Reader src,Type type)

{
  ErrorReporter *pEVar1;
  Type type_00;
  long lVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  uint64_t uVar8;
  EnumSchema EVar9;
  StructSchema SVar10;
  Which WVar11;
  anon_union_8_2_eba6ea51_for_Type_5 aVar12;
  ulong uVar13;
  ulong uVar14;
  char (*in_R8) [2];
  ReaderFor<DynamicEnum> RVar15;
  Fault f;
  Orphan<capnp::DynamicValue> local_130;
  Type local_f8;
  anon_union_8_2_eba6ea51_for_Type_5 local_e8;
  long lStack_e0;
  undefined8 *local_d8;
  ReaderFor<DynamicList> local_98;
  RawBrandedSchema *local_50;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_48;
  Type local_40;
  
  aVar12 = type.field_4;
  uVar7 = type._0_8_;
  local_f8.baseType = type.baseType;
  WVar11 = local_f8.baseType;
  local_f8.listDepth = type.listDepth;
  uVar4 = local_f8.listDepth;
  local_f8._3_5_ = type._3_5_;
  local_f8.field_4.scopeId = aVar12.scopeId;
  compileValueInner(&local_130,this,src,type);
  if (ANY_POINTER < local_130.type) goto switchD_001d4d91_default;
  uVar13 = uVar7 >> 0x20;
  switch(local_130.type) {
  case UNKNOWN:
    goto switchD_001d4a5e_caseD_0;
  case VOID:
    bVar5 = WVar11 == VOID;
    break;
  case BOOL:
    bVar5 = WVar11 == BOOL;
    break;
  case INT:
    Orphan<capnp::DynamicValue>::getReader((Reader *)&local_e8,&local_130);
    uVar7 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&local_e8);
    DynamicValue::Reader::~Reader((Reader *)&local_e8);
    if (-1 < (long)uVar7) {
      uVar7 = (ulong)local_f8.baseType;
      uVar4 = local_f8.listDepth;
      goto switchD_001d4a5e_caseD_4;
    }
    WVar11 = LIST;
    if (local_f8.listDepth == '\0') {
      WVar11 = local_f8.baseType;
    }
    switch(WVar11) {
    case INT8:
      uVar13 = 0xffffffffffffff80;
      break;
    case INT16:
      uVar13 = 0xffffffffffff8000;
      break;
    case INT32:
      uVar13 = 0xffffffff80000000;
      break;
    case INT64:
    case FLOAT32:
    case FLOAT64:
      goto switchD_001d4d91_caseD_5;
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
      uVar13 = 0;
      goto LAB_001d4f69;
    default:
      goto switchD_001d4d91_default;
    }
    if (uVar7 < uVar13) {
LAB_001d4f69:
      uVar7 = 0;
      if (src._reader.dataSize < 0x40) {
        uVar14 = 0;
      }
      else {
        uVar14 = (ulong)*(uint *)((long)src._reader.data + 4);
        if (0x9f < src._reader.dataSize) {
          uVar7 = (ulong)*(uint *)((long)src._reader.data + 0x10);
        }
      }
      (**this->errorReporter->_vptr_ErrorReporter)
                (this->errorReporter,uVar14,uVar7,"Integer value out of range.",0x1c);
      local_130.type = INT;
      local_130.field_1.listSchema.elementType.field_4 = local_e8;
      local_130.field_1.intValue = uVar13;
      if (local_130.builder.segment != (SegmentBuilder *)0x0) {
        capnp::_::OrphanBuilder::euthanize(&local_130.builder);
      }
      local_130.builder.capTable = (CapTableBuilder *)0x0;
      local_130.builder.location = (word *)0x0;
      local_130.builder.tag.content = 0;
      local_130.builder.segment = (SegmentBuilder *)0x0;
    }
    goto switchD_001d4d91_caseD_5;
  case UINT:
switchD_001d4a5e_caseD_4:
    uVar6 = 0xc;
    if (uVar4 == '\0') {
      uVar6 = (int)uVar7 - 2;
    }
    if (9 < (ushort)uVar6) goto switchD_001d4d91_default;
    uVar7 = *(ulong *)(&DAT_00264638 + (ulong)(uVar6 & 0xffff) * 8);
    Orphan<capnp::DynamicValue>::getReader((Reader *)&local_e8,&local_130);
    uVar8 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply((Reader *)&local_e8);
    DynamicValue::Reader::~Reader((Reader *)&local_e8);
    if (uVar7 < uVar8) {
      uVar13 = 0;
      if (src._reader.dataSize < 0x40) {
        uVar14 = 0;
      }
      else {
        uVar14 = (ulong)*(uint *)((long)src._reader.data + 4);
        if (0x9f < src._reader.dataSize) {
          uVar13 = (ulong)*(uint *)((long)src._reader.data + 0x10);
        }
      }
      (**this->errorReporter->_vptr_ErrorReporter)
                (this->errorReporter,uVar14,uVar13,"Integer value out of range.",0x1c);
      local_130.type = UINT;
      local_130.field_1.listSchema.elementType.field_4 = local_e8;
      local_130.field_1.uintValue = uVar7;
      if (local_130.builder.segment != (SegmentBuilder *)0x0) {
        capnp::_::OrphanBuilder::euthanize(&local_130.builder);
      }
      local_130.builder.segment._0_4_ = 0;
      local_130.builder.segment._4_4_ = 0;
      local_130.builder.capTable._0_4_ = 0;
      local_130.builder.capTable._4_4_ = 0;
      local_130.builder.tag.content = 0;
      local_130.builder.capTable = (CapTableBuilder *)0x0;
      local_130.builder.location = (word *)0x0;
    }
    else {
    }
    (__return_storage_ptr__->ptr).isSet = true;
    *(ulong *)&(__return_storage_ptr__->ptr).field_1 = CONCAT44(local_130._4_4_,local_130.type);
    *(int64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_130.field_1.intValue;
    *(anon_union_8_2_eba6ea51_for_Type_5 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
         local_130.field_1.listSchema.elementType.field_4;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
         local_130.builder.segment._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x24) =
         local_130.builder.segment._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
         local_130.builder.capTable._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x2c) =
         local_130.builder.capTable._4_4_;
    (__return_storage_ptr__->ptr).field_1.value.builder.location = local_130.builder.location;
    goto LAB_001d4bf2;
  case FLOAT:
    if ((WVar11 & ~BOOL) == FLOAT32 && uVar4 == '\0') goto switchD_001d4d91_caseD_5;
    goto switchD_001d4d91_default;
  case TEXT:
    bVar5 = WVar11 == TEXT;
    break;
  case DATA:
    bVar5 = WVar11 == DATA;
    break;
  case LIST:
    if (uVar4 == '\0') {
      if (WVar11 == ANY_POINTER) {
        if (aVar12.schema != (RawBrandedSchema *)0x0) {
          uVar13 = 0;
        }
        if ((uVar7 >> 0x18 & 1) != 0) {
          uVar13 = 0;
        }
        if ((uVar13 & 0xfffd) == 0) goto switchD_001d4d91_caseD_5;
      }
    }
    else {
      Orphan<capnp::DynamicValue>::getReader((Reader *)&local_e8,&local_130);
      DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                (&local_98,(Reader *)&local_e8);
      local_50 = (RawBrandedSchema *)local_98.schema.elementType._0_8_;
      aStack_48 = local_98.schema.elementType.field_4;
      local_40 = (Type)Type::asList(&local_f8);
      bVar5 = Type::operator==((Type *)&local_50,&local_40);
      DynamicValue::Reader::~Reader((Reader *)&local_e8);
      if (bVar5) goto switchD_001d4d91_caseD_5;
    }
    goto switchD_001d4d91_default;
  case ENUM:
    if (uVar4 == '\0' && WVar11 == ENUM) {
      Orphan<capnp::DynamicValue>::getReader((Reader *)&local_e8,&local_130);
      RVar15 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                         ((Reader *)&local_e8);
      EVar9 = Type::asEnum(&local_f8);
      DynamicValue::Reader::~Reader((Reader *)&local_e8);
      if ((RawBrandedSchema *)RVar15.schema.super_Schema.raw == EVar9.super_Schema.raw)
      goto switchD_001d4d91_caseD_5;
    }
    goto switchD_001d4d91_default;
  case STRUCT:
    if (uVar4 == '\0' && WVar11 == STRUCT) {
      Orphan<capnp::DynamicValue>::getReader((Reader *)&local_e8,&local_130);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&local_98,(Reader *)&local_e8);
      uVar3 = local_98.schema.elementType._0_8_;
      SVar10 = Type::asStruct(&local_f8);
      DynamicValue::Reader::~Reader((Reader *)&local_e8);
      if ((Schema)uVar3 != SVar10.super_Schema.raw) goto switchD_001d4d91_default;
    }
    else if ((WVar11 != ANY_POINTER || uVar4 != '\0') ||
            (1 < type.field_3.paramIndex &&
             (aVar12.schema == (RawBrandedSchema *)0x0 &&
             ((undefined1  [16])type & (undefined1  [16])0x1000000) == (undefined1  [16])0x0)))
    goto switchD_001d4d91_default;
    goto switchD_001d4d91_caseD_5;
  case CAPABILITY:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0xb14,FAILED,(char *)0x0,"\"Interfaces can\'t have literal values.\"",
               (char (*) [38])"Interfaces can\'t have literal values.");
    kj::_::Debug::Fault::fatal((Fault *)&local_e8);
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0xb17,FAILED,(char *)0x0,"\"AnyPointers can\'t have literal values.\"",
               (char (*) [39])"AnyPointers can\'t have literal values.");
    kj::_::Debug::Fault::fatal((Fault *)&local_e8);
  }
  if ((bool)(uVar4 == '\0' & bVar5)) {
switchD_001d4d91_caseD_5:
    (__return_storage_ptr__->ptr).isSet = true;
    *(ulong *)&(__return_storage_ptr__->ptr).field_1 = CONCAT44(local_130._4_4_,local_130.type);
    *(int64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_130.field_1.intValue;
    *(anon_union_8_2_eba6ea51_for_Type_5 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
         local_130.field_1.listSchema.elementType.field_4;
    (__return_storage_ptr__->ptr).field_1.value.builder.segment = local_130.builder.segment;
    (__return_storage_ptr__->ptr).field_1.value.builder.capTable = local_130.builder.capTable;
    (__return_storage_ptr__->ptr).field_1.value.builder.location = local_130.builder.location;
LAB_001d4bf2:
    (__return_storage_ptr__->ptr).field_1.value.builder.tag.content = local_130.builder.tag.content;
    local_130.builder.segment = (SegmentBuilder *)0x0;
    local_130.builder.location = (word *)0x0;
  }
  else {
switchD_001d4d91_default:
    pEVar1 = this->errorReporter;
    type_00.listDepth = local_f8.listDepth;
    type_00.baseType = local_f8.baseType;
    type_00.isImplicitParam = local_f8.isImplicitParam;
    type_00.field_3 = local_f8.field_3;
    type_00._6_2_ = local_f8._6_2_;
    type_00.field_4.schema = local_f8.field_4.schema;
    makeTypeName((String *)&local_98,this,type_00);
    kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
              ((String *)&local_e8,(kj *)"Type mismatch; expected ",(char (*) [25])&local_98,
               (String *)0x2549e8,in_R8);
    aVar12 = local_e8;
    if (lStack_e0 == 0) {
      aVar12.schema = (RawBrandedSchema *)0x2781dd;
    }
    uVar7 = 0;
    if (src._reader.dataSize < 0x40) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)*(uint *)((long)src._reader.data + 4);
      if (0x9f < src._reader.dataSize) {
        uVar7 = (ulong)*(uint *)((long)src._reader.data + 0x10);
      }
    }
    (**pEVar1->_vptr_ErrorReporter)
              (pEVar1,uVar13,uVar7,aVar12.schema,lStack_e0 + (ulong)(lStack_e0 == 0));
    lVar2 = lStack_e0;
    aVar12 = local_e8;
    if (local_e8.schema != (RawBrandedSchema *)0x0) {
      local_e8.schema = (RawBrandedSchema *)0x0;
      lStack_e0 = 0;
      (**(code **)*local_d8)(local_d8,aVar12.schema,1,lVar2,lVar2,0);
    }
    aVar12 = local_98.schema.elementType.field_4;
    uVar3 = local_98.schema.elementType._0_8_;
    if ((RawBrandedSchema *)local_98.schema.elementType._0_8_ != (RawBrandedSchema *)0x0) {
      local_98.schema.elementType._0_8_ = (RawBrandedSchema *)0x0;
      local_98.schema.elementType.field_4.schema = (RawBrandedSchema *)0x0;
      (*(code *)(local_98.reader.segment)->arena->_vptr_Arena)
                (local_98.reader.segment,uVar3,1,aVar12.schema,aVar12.schema,0);
    }
switchD_001d4a5e_caseD_0:
    (__return_storage_ptr__->ptr).isSet = false;
  }
  if (local_130.builder.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&local_130.builder);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Orphan<DynamicValue>> ValueTranslator::compileValue(Expression::Reader src, Type type) {
  Orphan<DynamicValue> result = compileValueInner(src, type);

  switch (result.getType()) {
    case DynamicValue::UNKNOWN:
      // Error already reported.
      return nullptr;

    case DynamicValue::VOID:
      if (type.isVoid()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::BOOL:
      if (type.isBool()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::INT: {
      int64_t value = result.getReader().as<int64_t>();
      if (value < 0) {
        int64_t minValue = 1;
        switch (type.which()) {
          case schema::Type::INT8: minValue = (int8_t)kj::minValue; break;
          case schema::Type::INT16: minValue = (int16_t)kj::minValue; break;
          case schema::Type::INT32: minValue = (int32_t)kj::minValue; break;
          case schema::Type::INT64: minValue = (int64_t)kj::minValue; break;
          case schema::Type::UINT8: minValue = (uint8_t)kj::minValue; break;
          case schema::Type::UINT16: minValue = (uint16_t)kj::minValue; break;
          case schema::Type::UINT32: minValue = (uint32_t)kj::minValue; break;
          case schema::Type::UINT64: minValue = (uint64_t)kj::minValue; break;

          case schema::Type::FLOAT32:
          case schema::Type::FLOAT64:
            // Any integer is acceptable.
            minValue = (int64_t)kj::minValue;
            break;

          default: break;
        }
        if (minValue == 1) break;

        if (value < minValue) {
          errorReporter.addErrorOn(src, "Integer value out of range.");
          result = minValue;
        }
        return kj::mv(result);
      }

    } // fallthrough -- value is positive, so we can just go on to the uint case below.

    case DynamicValue::UINT: {
      uint64_t maxValue = 0;
      switch (type.which()) {
        case schema::Type::INT8: maxValue = (int8_t)kj::maxValue; break;
        case schema::Type::INT16: maxValue = (int16_t)kj::maxValue; break;
        case schema::Type::INT32: maxValue = (int32_t)kj::maxValue; break;
        case schema::Type::INT64: maxValue = (int64_t)kj::maxValue; break;
        case schema::Type::UINT8: maxValue = (uint8_t)kj::maxValue; break;
        case schema::Type::UINT16: maxValue = (uint16_t)kj::maxValue; break;
        case schema::Type::UINT32: maxValue = (uint32_t)kj::maxValue; break;
        case schema::Type::UINT64: maxValue = (uint64_t)kj::maxValue; break;

        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
          // Any integer is acceptable.
          maxValue = (uint64_t)kj::maxValue;
          break;

        default: break;
      }
      if (maxValue == 0) break;

      if (result.getReader().as<uint64_t>() > maxValue) {
        errorReporter.addErrorOn(src, "Integer value out of range.");
        result = maxValue;
      }
      return kj::mv(result);
    }

    case DynamicValue::FLOAT:
      if (type.isFloat32() || type.isFloat64()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::TEXT:
      if (type.isText()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::DATA:
      if (type.isData()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::LIST:
      if (type.isList()) {
        if (result.getReader().as<DynamicList>().getSchema() == type.asList()) {
          return kj::mv(result);
        }
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::LIST:
            return kj::mv(result);
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            break;
        }
      }
      break;

    case DynamicValue::ENUM:
      if (type.isEnum()) {
        if (result.getReader().as<DynamicEnum>().getSchema() == type.asEnum()) {
          return kj::mv(result);
        }
      }
      break;

    case DynamicValue::STRUCT:
      if (type.isStruct()) {
        if (result.getReader().as<DynamicStruct>().getSchema() == type.asStruct()) {
          return kj::mv(result);
        }
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
            return kj::mv(result);
          case schema::Type::AnyPointer::Unconstrained::LIST:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            break;
        }
      }
      break;

    case DynamicValue::CAPABILITY:
      KJ_FAIL_ASSERT("Interfaces can't have literal values.");

    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("AnyPointers can't have literal values.");
  }

  errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
  return nullptr;
}